

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

AsinLayerParams *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::AsinLayerParams>(Arena *arena)

{
  AsinLayerParams *pAVar1;
  
  if (arena != (Arena *)0x0) {
    pAVar1 = DoCreateMessage<CoreML::Specification::AsinLayerParams>(arena);
    return pAVar1;
  }
  pAVar1 = (AsinLayerParams *)operator_new(0x18);
  CoreML::Specification::AsinLayerParams::AsinLayerParams(pAVar1,(Arena *)0x0,false);
  return pAVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }